

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void gc_finalize(lua_State *L)

{
  uint uVar1;
  lua_State *L_00;
  cTValue *mo_00;
  TValue *pTVar2;
  global_State *in_RDI;
  TValue *tv;
  TValue tmp;
  cTValue *mo;
  GCobj *o;
  global_State *g;
  GCstr *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  GCobj *o_00;
  GCtab *in_stack_ffffffffffffff38;
  GCobj *in_stack_ffffffffffffff48;
  
  L_00 = (lua_State *)(ulong)in_RDI->strmask;
  uVar1 = *(uint *)(ulong)*(uint *)((long)&L_00[1].cframe + 4);
  mo_00 = (cTValue *)(ulong)uVar1;
  if (mo_00 == (cTValue *)(ulong)*(uint *)((long)&L_00[1].cframe + 4)) {
    *(undefined4 *)((long)&L_00[1].cframe + 4) = 0;
  }
  else {
    *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
     (ulong)*(uint *)((long)&L_00[1].cframe + 4) = (mo_00->field_2).field_0;
  }
  if (*(uint8_t *)((long)&(mo_00->field_2).it + 1) == '\n') {
    (mo_00->field_2).field_0 =
         (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)L_00[1].maxstack.ptr32
    ;
    L_00[1].maxstack.ptr32 = uVar1;
    *(byte *)&(mo_00->field_2).it = (byte)(mo_00->field_2).it & 0xf8 | *(byte *)&L_00[1].top & 3;
    *(byte *)&(mo_00->field_2).it = (byte)(mo_00->field_2).it & 0xef;
    pTVar2 = lj_tab_set(L_00,(GCtab *)&mo_00->field_2,(cTValue *)in_stack_ffffffffffffff48);
    if ((pTVar2->field_2).it != 0xffffffff) {
      *(undefined1 *)((long)&L_00[1].top + 2) = 0;
      (pTVar2->field_2).it = 0xffffffff;
      gc_call_finalizer(in_RDI,L_00,mo_00,in_stack_ffffffffffffff48);
    }
  }
  else {
    *(undefined4 *)mo_00 = *(undefined4 *)(ulong)*(uint *)&L_00[4].base;
    *(uint *)(ulong)*(uint *)&L_00[4].base = uVar1;
    *(byte *)&(mo_00->field_2).it = (byte)(mo_00->field_2).it & 0xf8 | *(byte *)&L_00[1].top & 3;
    if (mo_00[2].u32.lo == 0) {
      o_00 = (GCobj *)0x0;
    }
    else if ((*(byte *)((ulong)mo_00[2].u32.lo + 6) & 4) == 0) {
      o_00 = (GCobj *)lj_meta_cache(in_stack_ffffffffffffff38,
                                    (MMS)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                                    in_stack_ffffffffffffff28);
    }
    else {
      o_00 = (GCobj *)0x0;
    }
    if (o_00 != (GCobj *)0x0) {
      gc_call_finalizer(in_RDI,L_00,mo_00,o_00);
    }
  }
  return;
}

Assistant:

static void gc_finalize(lua_State *L)
{
  global_State *g = G(L);
  GCobj *o = gcnext(gcref(g->gc.mmudata));
  cTValue *mo;
  lj_assertG(tvref(g->jit_base) == NULL, "finalizer called on trace");
  /* Unchain from list of userdata to be finalized. */
  if (o == gcref(g->gc.mmudata))
    setgcrefnull(g->gc.mmudata);
  else
    setgcrefr(gcref(g->gc.mmudata)->gch.nextgc, o->gch.nextgc);
#if LJ_HASFFI
  if (o->gch.gct == ~LJ_TCDATA) {
    TValue tmp, *tv;
    /* Add cdata back to the GC list and make it white. */
    setgcrefr(o->gch.nextgc, g->gc.root);
    setgcref(g->gc.root, o);
    makewhite(g, o);
    o->gch.marked &= (uint8_t)~LJ_GC_CDATA_FIN;
    /* Resolve finalizer. */
    setcdataV(L, &tmp, gco2cd(o));
    tv = lj_tab_set(L, tabref(g->gcroot[GCROOT_FFI_FIN]), &tmp);
    if (!tvisnil(tv)) {
      g->gc.nocdatafin = 0;
      copyTV(L, &tmp, tv);
      setnilV(tv);  /* Clear entry in finalizer table. */
      gc_call_finalizer(g, L, &tmp, o);
    }
    return;
  }
#endif
  /* Add userdata back to the main userdata list and make it white. */
  setgcrefr(o->gch.nextgc, mainthread(g)->nextgc);
  setgcref(mainthread(g)->nextgc, o);
  makewhite(g, o);
  /* Resolve the __gc metamethod. */
  mo = lj_meta_fastg(g, tabref(gco2ud(o)->metatable), MM_gc);
  if (mo)
    gc_call_finalizer(g, L, mo, o);
}